

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_tool.c
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  output_data_switch *poVar8;
  ulong uVar9;
  int i;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  system_id_t data;
  cpu_raw_data_array_t raw_array;
  cpu_list_t list;
  int local_9c;
  ulong local_98;
  long lStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  char **local_58;
  ulong local_50;
  ulong local_48;
  int local_40 [2];
  long local_38;
  
  iVar2 = 1;
  if (argc == 1) {
    need_output = 1;
    builtin_strncpy(raw_data_file,"raw.txt",8);
    builtin_strncpy(out_file,"report.txt",0xb);
    need_report = 1;
    verbose_level = 1;
  }
  else if (1 < argc) {
    local_50 = (ulong)(uint)argc;
    uVar12 = 1;
    local_58 = argv;
    do {
      pcVar7 = argv[uVar12];
      iVar2 = strcmp(pcVar7,"-h");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcVar7,"--help"), iVar2 == 0)) {
        local_48 = uVar12;
        puts("Usage: cpuid_tool [options]\n");
        puts("Options:");
        puts("  -h, --help       - Show this help");
        puts("  --load=<file>    - Load raw CPUID data from file");
        puts("  --save=<file>    - Acquire raw CPUID data and write it to file");
        puts("  --report, --all  - Report all decoded CPU info (w/o clock)");
        puts("  --clock          - in conjunction to --report: print CPU clock as well");
        puts("  --clock-rdtsc    - same as --clock, but use RDTSC for clock detection");
        puts("  --cpulist        - list all known CPUs");
        puts("  --sgx            - list SGX leaf data, if SGX is supported.");
        puts("  --hypervisor     - print hypervisor vendor if detected.");
        puts("  --quiet          - disable warnings");
        puts("  --outfile=<file> - redirect all output to this file, instead of stdout");
        puts("  --verbose, -v    - be extra verbose (more keys increase verbosiness level)");
        puts("  --version        - print library version");
        putchar(10);
        printf("Query switches (generate 1 line of output per switch; in order of appearance):");
        iVar2 = 0x50;
        lVar6 = -0x4b0;
        do {
          sVar4 = strlen(*(char **)((long)&DAT_00108b78 + lVar6));
          if (0x4c < (int)sVar4 + iVar2) {
            printf("\n  ");
            iVar2 = 2;
          }
          printf("%s");
          if (lVar6 != -0x18) {
            iVar2 = iVar2 + (int)sVar4 + 2;
            printf(", ");
          }
          lVar6 = lVar6 + 0x18;
        } while (lVar6 != 0);
        puts("\n");
        puts("If `-\' is used for <file>, then stdin/stdout will be used instead of files.");
        puts("When no options are present, the program behaves as if it was invoked with");
        puts("  cpuid_tool \"--save=raw.txt --outfile=report.txt --report --verbose\"");
        bVar13 = false;
        local_9c = 0;
        argv = local_58;
        uVar12 = local_48;
      }
      else {
        iVar2 = strncmp(pcVar7,"--load=",7);
        bVar14 = false;
        if (iVar2 == 0) {
          if (need_input == 0) {
            if (need_output == 0) {
              sVar4 = strlen(pcVar7);
              if (7 < sVar4) {
                need_input = 1;
                strcpy(raw_data_file,pcVar7 + 7);
                bVar14 = true;
                goto LAB_00102857;
              }
              main_cold_9();
            }
            else {
              main_cold_2();
            }
          }
          else {
            main_cold_1();
          }
        }
        else {
LAB_00102857:
          iVar2 = strncmp(pcVar7,"--save=",7);
          if (iVar2 == 0) {
            if (need_output == 0) {
              if (need_input == 0) {
                sVar4 = strlen(pcVar7);
                if (7 < sVar4) {
                  need_output = 1;
                  strcpy(raw_data_file,pcVar7 + 7);
                  bVar14 = true;
                  goto LAB_001028ba;
                }
                main_cold_8();
              }
              else {
                main_cold_4();
              }
            }
            else {
              main_cold_3();
            }
          }
          else {
LAB_001028ba:
            iVar2 = strncmp(pcVar7,"--outfile=",10);
            if (iVar2 == 0) {
              sVar4 = strlen(pcVar7);
              if (sVar4 < 0xb) {
                main_cold_7();
                goto LAB_00102cb6;
              }
              strcpy(out_file,pcVar7 + 10);
              bVar14 = true;
            }
            iVar2 = strcmp(pcVar7,"--report");
            if ((iVar2 == 0) || (iVar2 = strcmp(pcVar7,"--all"), iVar2 == 0)) {
              need_report = 1;
              bVar14 = true;
            }
            iVar2 = strcmp(pcVar7,"--clock");
            if (iVar2 == 0) {
              need_clockreport = 1;
              bVar14 = true;
            }
            iVar2 = strcmp(pcVar7,"--clock-rdtsc");
            if (iVar2 == 0) {
              bVar14 = true;
              need_clockreport = 1;
              need_timed_clockreport = 1;
            }
            iVar2 = strcmp(pcVar7,"--quiet");
            if (iVar2 == 0) {
              need_quiet = 1;
              bVar14 = true;
            }
            iVar2 = strcmp(pcVar7,"--verbose");
            if (iVar2 == 0) {
              verbose_level = verbose_level + 1;
              bVar14 = true;
            }
            iVar2 = strcmp(pcVar7,"--version");
            if (iVar2 == 0) {
              need_version = 1;
              bVar14 = true;
            }
            iVar2 = strcmp(pcVar7,"--cpulist");
            if (iVar2 == 0) {
              need_cpulist = 1;
              bVar14 = true;
            }
            iVar2 = strcmp(pcVar7,"--sgx");
            if (iVar2 == 0) {
              bVar14 = true;
              need_sgx = 1;
              need_identify = 1;
            }
            iVar2 = strcmp(pcVar7,"--hypervisor");
            if (iVar2 == 0) {
              bVar14 = true;
              need_hypervisor = 1;
              need_identify = 1;
            }
            if ((*pcVar7 == '-') && (pcVar7[1] == 'v')) {
              for (lVar6 = 0; pcVar7[lVar6 + 1] == 'v'; lVar6 = lVar6 + 1) {
              }
              if (pcVar7[lVar6 + 1] == '\0') {
                verbose_level = verbose_level + (int)lVar6;
                bVar14 = true;
              }
            }
            lVar6 = 8;
            do {
              iVar2 = strcmp(pcVar7,*(char **)((long)&matchtable[0].sw + lVar6));
              argv = local_58;
              if (iVar2 == 0) {
                lVar10 = (long)num_requests;
                if (0x3f < lVar10) {
                  main_cold_6();
                  local_9c = -1;
                }
                else {
                  num_requests = num_requests + 1;
                  requests[lVar10] =
                       *(output_data_switch *)
                        ((long)&__do_global_dtors_aux_fini_array_entry + lVar6);
                }
                bVar13 = 0x3f >= lVar10;
                argv = local_58;
                goto LAB_00102cc0;
              }
              lVar6 = lVar6 + 0x18;
            } while (lVar6 != 0x4b8);
            bVar13 = true;
            if (bVar14) goto LAB_00102cc0;
            main_cold_5();
          }
        }
LAB_00102cb6:
        local_9c = -1;
        bVar13 = false;
      }
LAB_00102cc0:
      iVar2 = local_9c;
      if (!bVar13) goto LAB_00102cdd;
      uVar12 = uVar12 + 1;
    } while (uVar12 != local_50);
    iVar2 = 1;
  }
LAB_00102cdd:
  local_68 = 0;
  uStack_60 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  lStack_90 = 0;
  local_78 = 0;
  if (iVar2 == 1) {
    if (need_quiet != 0) {
      cpuid_set_warn_function(0);
    }
    cpuid_set_verbosiness_level(verbose_level);
    if ((out_file[0] == '\0') || (CONCAT11(out_file[1],out_file[0]) == 0x2d)) {
      fout = _stdout;
    }
    else {
      fout = (FILE *)fopen(out_file,"wt");
      if ((FILE *)fout == (FILE *)0x0) {
        if (need_quiet != 0) {
          return -1;
        }
        main_cold_10();
        return -1;
      }
      atexit(close_out);
    }
    pFVar1 = fout;
    if (need_version != 0) {
      uVar5 = cpuid_lib_version();
      fprintf((FILE *)pFVar1,"%s\n",uVar5);
    }
    if (need_input == 0) {
      iVar2 = check_need_raw_data();
      if ((iVar2 != 0) && (iVar2 = cpuid_get_all_raw_data(&local_68), iVar2 < 0)) {
        if (need_quiet != 0) {
          return -1;
        }
        main_cold_12();
        return -1;
      }
    }
    else {
      iVar2 = cpuid_deserialize_all_raw_data(&local_68);
      if (iVar2 < 0) {
        if (need_quiet != 0) {
          return -1;
        }
        main_cold_11();
        return -1;
      }
    }
    if ((need_output == 0) || (iVar2 = cpuid_serialize_all_raw_data(&local_68), -1 < iVar2)) {
      if (need_report != 0) {
        if (0 < verbose_level) {
          printf("Writing decoded CPU report to `%s\'\n",out_file);
        }
        iVar2 = cpu_identify_all(&local_68,&local_98);
        pFVar1 = fout;
        if (iVar2 < 0) {
          uVar5 = cpuid_error();
          fprintf((FILE *)pFVar1,"Error identifying the CPU: %s\n",uVar5);
        }
        else if ((char)local_98 == '\0') {
          fwrite("The cpu_types array is empty: there is nothing to report\n",0x39,1,(FILE *)fout);
        }
        else {
          fwrite("CPUID is present\n",0x11,1,(FILE *)fout);
          if ((char)local_98 != '\0') {
            lVar6 = 0x5c;
            uVar12 = 0;
            do {
              fprintf((FILE *)fout,"CPU Info for type #%d:\n------------------\n",
                      uVar12 & 0xffffffff);
              pFVar1 = fout;
              lVar10 = uVar12 * 9000;
              uVar5 = cpu_architecture_str(*(undefined4 *)(lStack_90 + lVar10));
              fprintf((FILE *)pFVar1,"  arch       : %s\n",uVar5);
              pFVar1 = fout;
              uVar5 = cpu_feature_level_str(*(undefined4 *)(lStack_90 + 4 + lVar10));
              fprintf((FILE *)pFVar1,"  feat_level : %s\n",uVar5);
              pFVar1 = fout;
              uVar5 = cpu_purpose_str(*(undefined4 *)(lStack_90 + 0x2320 + lVar10));
              fprintf((FILE *)pFVar1,"  purpose    : %s\n",uVar5);
              fprintf((FILE *)fout,"  vendor_str : `%s\'\n",lStack_90 + lVar10 + 8);
              fprintf((FILE *)fout,"  vendor id  : %d\n",(ulong)*(uint *)(lStack_90 + 0x58 + lVar10)
                     );
              fprintf((FILE *)fout,"  brand_str  : `%s\'\n",lStack_90 + lVar10 + 0x18);
              if (*(int *)(lStack_90 + lVar10) == 1) {
                fprintf((FILE *)fout,"  implementer: %d (%02Xh)\n",
                        (ulong)*(byte *)(lStack_90 + lVar10 + 0x1f0));
                fprintf((FILE *)fout,"  variant    : %d (%02Xh)\n",
                        (ulong)*(byte *)(lStack_90 + 0x1f1 + lVar10));
                fprintf((FILE *)fout,"  part_num   : %d (%02Xh)\n",
                        (ulong)*(ushort *)(lStack_90 + 0x1f2 + lVar10));
                uVar9 = (ulong)*(byte *)(lStack_90 + 500 + lVar10);
                pcVar7 = "  revision   : %d (%02Xh)\n";
LAB_0010310e:
                fprintf((FILE *)fout,pcVar7,uVar9);
              }
              else if (*(int *)(lStack_90 + lVar10) == 0) {
                fprintf((FILE *)fout,"  family     : %d (%02Xh)\n",
                        (ulong)*(uint *)(lStack_90 + lVar10 + 0x1f0));
                fprintf((FILE *)fout,"  model      : %d (%02Xh)\n",
                        (ulong)*(uint *)(lStack_90 + 500 + lVar10));
                fprintf((FILE *)fout,"  stepping   : %d (%02Xh)\n",
                        (ulong)*(uint *)(lStack_90 + 0x1f8 + lVar10));
                fprintf((FILE *)fout,"  ext_family : %d (%02Xh)\n",
                        (ulong)*(uint *)(lStack_90 + 0x1fc + lVar10));
                uVar9 = (ulong)*(uint *)(lStack_90 + 0x200 + lVar10);
                pcVar7 = "  ext_model  : %d (%02Xh)\n";
                goto LAB_0010310e;
              }
              fprintf((FILE *)fout,"  num_cores  : %d\n",
                      (ulong)*(uint *)(lStack_90 + 0x238 + lVar10));
              fprintf((FILE *)fout,"  num_logical: %d\n",
                      (ulong)*(uint *)(lStack_90 + 0x23c + lVar10));
              fprintf((FILE *)fout,"  tot_logical: %d\n",
                      (ulong)*(uint *)(lStack_90 + 0x240 + lVar10));
              pFVar1 = fout;
              uVar5 = affinity_mask_str(lStack_90 + lVar10 + 800);
              fprintf((FILE *)pFVar1,"  affi_mask  : 0x%s\n",uVar5);
              if (*(int *)(lStack_90 + lVar10) == 0) {
                fprintf((FILE *)fout,"  L1 D cache : %d KB\n",
                        (ulong)*(uint *)(lStack_90 + lVar10 + 0x244));
                fprintf((FILE *)fout,"  L1 I cache : %d KB\n",
                        (ulong)*(uint *)(lStack_90 + 0x248 + lVar10));
                fprintf((FILE *)fout,"  L2 cache   : %d KB\n",
                        (ulong)*(uint *)(lStack_90 + 0x24c + lVar10));
                fprintf((FILE *)fout,"  L3 cache   : %d KB\n",
                        (ulong)*(uint *)(lStack_90 + 0x250 + lVar10));
                fprintf((FILE *)fout,"  L4 cache   : %d KB\n",
                        (ulong)*(uint *)(lStack_90 + 0x254 + lVar10));
                fprintf((FILE *)fout,"  L1D assoc. : %d-way\n",
                        (ulong)*(uint *)(lStack_90 + 0x25c + lVar10));
                fprintf((FILE *)fout,"  L1I assoc. : %d-way\n",
                        (ulong)*(uint *)(lStack_90 + 0x260 + lVar10));
                fprintf((FILE *)fout,"  L2 assoc.  : %d-way\n",
                        (ulong)*(uint *)(lStack_90 + 0x264 + lVar10));
                fprintf((FILE *)fout,"  L3 assoc.  : %d-way\n",
                        (ulong)*(uint *)(lStack_90 + 0x268 + lVar10));
                fprintf((FILE *)fout,"  L4 assoc.  : %d-way\n",
                        (ulong)*(uint *)(lStack_90 + 0x26c + lVar10));
                fprintf((FILE *)fout,"  L1D line sz: %d bytes\n",
                        (ulong)*(uint *)(lStack_90 + 0x274 + lVar10));
                fprintf((FILE *)fout,"  L1I line sz: %d bytes\n",
                        (ulong)*(uint *)(lStack_90 + 0x278 + lVar10));
                fprintf((FILE *)fout,"  L2 line sz : %d bytes\n",
                        (ulong)*(uint *)(lStack_90 + 0x27c + lVar10));
                fprintf((FILE *)fout,"  L3 line sz : %d bytes\n",
                        (ulong)*(uint *)(lStack_90 + 0x280 + lVar10));
                fprintf((FILE *)fout,"  L4 line sz : %d bytes\n",
                        (ulong)*(uint *)(lStack_90 + 0x284 + lVar10));
                fprintf((FILE *)fout,"  L1D inst.  : %d\n",
                        (ulong)*(uint *)(lStack_90 + 0x288 + lVar10));
                fprintf((FILE *)fout,"  L1I inst.  : %d\n",
                        (ulong)*(uint *)(lStack_90 + 0x28c + lVar10));
                fprintf((FILE *)fout,"  L2 inst.   : %d\n",
                        (ulong)*(uint *)(lStack_90 + 0x290 + lVar10));
                fprintf((FILE *)fout,"  L3 inst.   : %d\n",
                        (ulong)*(uint *)(lStack_90 + 0x294 + lVar10));
                fprintf((FILE *)fout,"  L4 inst.   : %d\n",
                        (ulong)*(uint *)(lStack_90 + 0x298 + lVar10));
                pcVar7 = "authoritative";
                if (*(char *)(lStack_90 + 0x2e0 + lVar10) == '\0') {
                  pcVar7 = "non-authoritative";
                }
                fprintf((FILE *)fout,"  SSE units  : %d bits (%s)\n",
                        (ulong)*(uint *)(lStack_90 + 0x204 + lVar10),pcVar7);
              }
              fprintf((FILE *)fout,"  code name  : `%s\'\n",lStack_90 + lVar10 + 0x29c);
              fwrite("  features   :",0xe,1,(FILE *)fout);
              uVar9 = 0;
              do {
                pFVar1 = fout;
                if (*(char *)(uVar9 + lStack_90 + lVar6) != '\0') {
                  uVar5 = cpu_feature_str(uVar9 & 0xffffffff);
                  fprintf((FILE *)pFVar1," %s",uVar5);
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 != 0x150);
              fputc(10,(FILE *)fout);
              uVar12 = uVar12 + 1;
              lVar6 = lVar6 + 9000;
            } while (uVar12 < (local_98 & 0xff));
          }
        }
        pFVar1 = fout;
        if (need_clockreport != 0) {
          if (need_timed_clockreport == 0) {
            uVar3 = cpu_clock();
          }
          else {
            uVar3 = cpu_clock_measure(400,1);
          }
          fprintf((FILE *)pFVar1,"  cpu clock  : %d MHz\n",(ulong)uVar3);
        }
      }
      uVar12 = (ulong)num_requests;
      bVar13 = 0 < (long)uVar12;
      if (0 < (long)uVar12) {
        poVar8 = requests;
        uVar9 = 1;
        do {
          if ((*poVar8 != NEED_CLOCK_RDTSC) && (*poVar8 != NEED_CLOCK)) break;
          bVar13 = uVar9 < uVar12;
          poVar8 = poVar8 + 1;
          bVar14 = uVar9 != uVar12;
          uVar9 = uVar9 + 1;
        } while (bVar14);
      }
      if (((bool)(0 < num_requests & (need_report == 0 | bVar13))) || (need_identify != 0)) {
        iVar2 = check_need_raw_data();
        if (iVar2 == 0) {
          if (0 < num_requests) {
            poVar8 = requests;
            lVar6 = 0;
            do {
              print_info(*poVar8,(cpu_id_t *)0x0);
              lVar6 = lVar6 + 1;
              poVar8 = poVar8 + 1;
            } while (lVar6 < num_requests);
          }
        }
        else {
          iVar2 = cpu_identify_all(&local_68,&local_98);
          if (iVar2 < 0) {
            if (need_quiet != 0) {
              return -1;
            }
            main_cold_14();
            return -1;
          }
          if ((char)local_98 != '\0') {
            uVar12 = 0;
            do {
              if ((uVar12 != 0) && ((char)local_68 != '\0')) {
                fwrite("--------------------------------------------------------------------------------\n"
                       ,0x51,1,(FILE *)fout);
              }
              if (0 < num_requests) {
                poVar8 = requests;
                lVar6 = 0;
                do {
                  print_info(*poVar8,(cpu_id_t *)(lStack_90 + uVar12 * 9000));
                  lVar6 = lVar6 + 1;
                  poVar8 = poVar8 + 1;
                } while (lVar6 < num_requests);
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 < (local_98 & 0xff));
          }
        }
      }
      if (need_cpulist != 0) {
        lVar6 = 0;
        do {
          fprintf((FILE *)fout,"-----%s-----\n",(&PTR_anon_var_dwarf_d40_00108b70)[lVar6 * 2]);
          cpuid_get_cpu_list((&DAT_00108b78)[lVar6 * 4],local_40);
          if (0 < local_40[0]) {
            lVar10 = 0;
            do {
              fprintf((FILE *)fout,"%s\n",*(undefined8 *)(local_38 + lVar10 * 8));
              lVar10 = lVar10 + 1;
            } while (lVar10 < local_40[0]);
          }
          cpuid_free_cpu_list(local_40);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x1c);
      }
      uVar5 = uStack_60;
      lVar6 = lStack_90;
      if (need_sgx != 0) {
        pcVar11 = "present";
        pcVar7 = "present";
        if (*(uint *)(lStack_90 + 0x208) == 0) {
          pcVar7 = "absent";
        }
        fprintf((FILE *)fout,"SGX: %d (%s)\n",(ulong)*(uint *)(lStack_90 + 0x208),pcVar7);
        if (*(int *)(lVar6 + 0x208) != 0) {
          fprintf((FILE *)fout,"SGX max enclave size (32-bit): 2^%d\n",
                  (ulong)*(byte *)(lVar6 + 0x20c));
          fprintf((FILE *)fout,"SGX max enclave size (64-bit): 2^%d\n",
                  (ulong)*(byte *)(lVar6 + 0x20d));
          pcVar7 = "present";
          if (*(byte *)(lVar6 + 0x20e) == 0) {
            pcVar7 = "absent";
          }
          fprintf((FILE *)fout,"SGX1 extensions              : %d (%s)\n",
                  (ulong)*(byte *)(lVar6 + 0x20e),pcVar7);
          if (*(byte *)(lVar6 + 0x20f) == 0) {
            pcVar11 = "absent";
          }
          fprintf((FILE *)fout,"SGX2 extensions              : %d (%s)\n",
                  (ulong)*(byte *)(lVar6 + 0x20f),pcVar11);
          fprintf((FILE *)fout,"SGX MISCSELECT               : %08x\n",
                  (ulong)*(uint *)(lVar6 + 0x220));
          fprintf((FILE *)fout,"SGX SECS.ATTRIBUTES mask     : %016llx\n",
                  *(undefined8 *)(lVar6 + 0x228));
          fprintf((FILE *)fout,"SGX SECS.XSAVE feature mask  : %016llx\n",
                  *(undefined8 *)(lVar6 + 0x230));
          fprintf((FILE *)fout,"SGX EPC sections count       : %d\n",(ulong)*(uint *)(lVar6 + 0x21c)
                 );
          if (0 < *(int *)(lVar6 + 0x21c)) {
            uVar3 = 0;
            do {
              auVar15 = cpuid_get_epc(uVar3,uVar5);
              fprintf((FILE *)fout,"    SGX EPC section #%-8d: start = %llx, size = %llu\n",
                      (ulong)uVar3,auVar15._0_8_,auVar15._8_8_);
              uVar3 = uVar3 + 1;
            } while ((int)uVar3 < *(int *)(lVar6 + 0x21c));
          }
        }
      }
      if (need_hypervisor != 0) {
        iVar2 = cpuid_get_hypervisor(uStack_60,lStack_90);
        lVar6 = 8;
        pcVar7 = (char *)0x0;
        do {
          if (*(int *)((long)&PTR_anon_var_dwarf_f50_00108d30 + lVar6) == iVar2) {
            pcVar7 = *(char **)(&UNK_00108d28 + lVar6);
            break;
          }
          lVar6 = lVar6 + 0x10;
        } while (lVar6 != 0x98);
        pcVar11 = "unknown";
        if (pcVar7 != (char *)0x0) {
          pcVar11 = pcVar7;
        }
        fprintf((FILE *)fout,"Hypervisor vendor: %s\n",pcVar11);
        if (iVar2 == 0) {
          fwrite("Caution: no hypervisor detected from CPUID bits, but a hypervisor may be hidden.\nRefer to https://github.com/anrieff/libcpuid/issues/90#issuecomment-296568713\n"
                 ,0x9f,1,(FILE *)fout);
        }
      }
      cpuid_free_raw_data_array(&local_68);
      cpuid_free_system_id(&local_98);
      iVar2 = 0;
    }
    else {
      iVar2 = -1;
      if (need_quiet == 0) {
        main_cold_13();
      }
    }
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
	int parseres = parse_cmdline(argc, argv);
	int i, readres, writeres;
	int only_clock_queries;
	uint8_t cpu_type_index;
	struct cpu_raw_data_array_t raw_array = {
		.with_affinity = false,
		.num_raw       = 0,
		.raw           = NULL
	};
	struct system_id_t data = {
		.num_cpu_types = 0
	};

	if (parseres != 1)
		return parseres;

	/* In quiet mode, disable libcpuid warning messages: */
	if (need_quiet)
		cpuid_set_warn_function(NULL);

	cpuid_set_verbosiness_level(verbose_level);

	/* Redirect output, if necessary: */
	if (strcmp(out_file, "") && strcmp(out_file, "-")) {
		fout = fopen(out_file, "wt");
		if (!fout) {
			if (!need_quiet)
				fprintf(stderr, "Cannot open `%s' for writing!\n", out_file);
			return -1;
		}
		atexit(close_out);
	} else {
		fout = stdout;
	}

	/* If requested, print library version: */
	if (need_version)
		fprintf(fout, "%s\n", cpuid_lib_version());

	if (need_input) {
		/* We have a request to input raw CPUID data from file: */
		if (!strcmp(raw_data_file, "-"))
			/* Input from stdin */
			readres = cpuid_deserialize_all_raw_data(&raw_array, "");
		else
			/* Input from file */
			readres = cpuid_deserialize_all_raw_data(&raw_array, raw_data_file);
		if (readres < 0) {
			if (!need_quiet) {
				fprintf(stderr, "Cannot deserialize raw data from ");
				if (!strcmp(raw_data_file, "-"))
					fprintf(stderr, "stdin\n");
				else
					fprintf(stderr, "file `%s'\n", raw_data_file);
				/* Print the error message */
				fprintf(stderr, "Error: %s\n", cpuid_error());
			}
			return -1;
		}
	} else {
		if (check_need_raw_data()) {
			/* Try to obtain raw CPUID data from the CPU: */
			readres = cpuid_get_all_raw_data(&raw_array);
			if (readres < 0) {
				if (!need_quiet) {
					fprintf(stderr, "Cannot obtain raw CPU data!\n");
					fprintf(stderr, "Error: %s\n", cpuid_error());
				}
				return -1;
			}
		}
	}

	/* Need to dump raw CPUID data to file: */
	if (need_output) {
		if (!strcmp(raw_data_file, "-"))
			/* Serialize to stdout */
			writeres = cpuid_serialize_all_raw_data(&raw_array, "");
		else
			/* Serialize to file */
			writeres = cpuid_serialize_all_raw_data(&raw_array, raw_data_file);
		if (writeres < 0) {
			if (!need_quiet) {
				fprintf(stderr, "Cannot serialize raw data to ");
				if (!strcmp(raw_data_file, "-"))
					fprintf(stderr, "stdout\n");
				else
					fprintf(stderr, "file `%s'\n", raw_data_file);
				/* Print the error message */
				fprintf(stderr, "Error: %s\n", cpuid_error());
			}
			return -1;
		}
	}
	if (need_report) {
		if (verbose_level >= 1) {
			printf("Writing decoded CPU report to `%s'\n", out_file);
		}
		/*
		 * Try CPU identification
		 * (this fill the `data' structure with decoded CPU features)
		 */
		if (cpu_identify_all(&raw_array, &data) < 0)
			fprintf(fout, "Error identifying the CPU: %s\n", cpuid_error());
		else if (data.num_cpu_types == 0)
			fprintf(fout, "The cpu_types array is empty: there is nothing to report\n");
		else {
			/* Write a thorough report of cpu_id_t structure to output (usually stdout) */
			fprintf(fout, "CPUID is present\n");
			/* OK, now write what we have in `data'...: */
			for (cpu_type_index = 0; cpu_type_index < data.num_cpu_types; cpu_type_index++) {
				fprintf(fout, "CPU Info for type #%d:\n------------------\n", cpu_type_index);
				fprintf(fout, "  arch       : %s\n", cpu_architecture_str(data.cpu_types[cpu_type_index].architecture));
				fprintf(fout, "  feat_level : %s\n", cpu_feature_level_str(data.cpu_types[cpu_type_index].feature_level));
				fprintf(fout, "  purpose    : %s\n", cpu_purpose_str(data.cpu_types[cpu_type_index].purpose));
				fprintf(fout, "  vendor_str : `%s'\n", data.cpu_types[cpu_type_index].vendor_str);
				fprintf(fout, "  vendor id  : %d\n", (int) data.cpu_types[cpu_type_index].vendor);
				fprintf(fout, "  brand_str  : `%s'\n", data.cpu_types[cpu_type_index].brand_str);
				if (data.cpu_types[cpu_type_index].architecture == ARCHITECTURE_X86) {
					fprintf(fout, "  family     : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.family, data.cpu_types[cpu_type_index].x86.family);
					fprintf(fout, "  model      : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.model, data.cpu_types[cpu_type_index].x86.model);
					fprintf(fout, "  stepping   : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.stepping, data.cpu_types[cpu_type_index].x86.stepping);
					fprintf(fout, "  ext_family : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.ext_family, data.cpu_types[cpu_type_index].x86.ext_family);
					fprintf(fout, "  ext_model  : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.ext_model, data.cpu_types[cpu_type_index].x86.ext_model);
				}
				else if (data.cpu_types[cpu_type_index].architecture == ARCHITECTURE_ARM) {
					fprintf(fout, "  implementer: %d (%02Xh)\n", data.cpu_types[cpu_type_index].arm.implementer, data.cpu_types[cpu_type_index].arm.implementer);
					fprintf(fout, "  variant    : %d (%02Xh)\n", data.cpu_types[cpu_type_index].arm.variant, data.cpu_types[cpu_type_index].arm.variant);
					fprintf(fout, "  part_num   : %d (%02Xh)\n", data.cpu_types[cpu_type_index].arm.part_num, data.cpu_types[cpu_type_index].arm.part_num);
					fprintf(fout, "  revision   : %d (%02Xh)\n", data.cpu_types[cpu_type_index].arm.revision, data.cpu_types[cpu_type_index].arm.revision);
				}
				fprintf(fout, "  num_cores  : %d\n", data.cpu_types[cpu_type_index].num_cores);
				fprintf(fout, "  num_logical: %d\n", data.cpu_types[cpu_type_index].num_logical_cpus);
				fprintf(fout, "  tot_logical: %d\n", data.cpu_types[cpu_type_index].total_logical_cpus);
				fprintf(fout, "  affi_mask  : 0x%s\n", affinity_mask_str(&data.cpu_types[cpu_type_index].affinity_mask));
				if (data.cpu_types[cpu_type_index].architecture == ARCHITECTURE_X86) {
					fprintf(fout, "  L1 D cache : %d KB\n", data.cpu_types[cpu_type_index].l1_data_cache);
					fprintf(fout, "  L1 I cache : %d KB\n", data.cpu_types[cpu_type_index].l1_instruction_cache);
					fprintf(fout, "  L2 cache   : %d KB\n", data.cpu_types[cpu_type_index].l2_cache);
					fprintf(fout, "  L3 cache   : %d KB\n", data.cpu_types[cpu_type_index].l3_cache);
					fprintf(fout, "  L4 cache   : %d KB\n", data.cpu_types[cpu_type_index].l4_cache);
					fprintf(fout, "  L1D assoc. : %d-way\n", data.cpu_types[cpu_type_index].l1_data_assoc);
					fprintf(fout, "  L1I assoc. : %d-way\n", data.cpu_types[cpu_type_index].l1_instruction_assoc);
					fprintf(fout, "  L2 assoc.  : %d-way\n", data.cpu_types[cpu_type_index].l2_assoc);
					fprintf(fout, "  L3 assoc.  : %d-way\n", data.cpu_types[cpu_type_index].l3_assoc);
					fprintf(fout, "  L4 assoc.  : %d-way\n", data.cpu_types[cpu_type_index].l4_assoc);
					fprintf(fout, "  L1D line sz: %d bytes\n", data.cpu_types[cpu_type_index].l1_data_cacheline);
					fprintf(fout, "  L1I line sz: %d bytes\n", data.cpu_types[cpu_type_index].l1_instruction_cacheline);
					fprintf(fout, "  L2 line sz : %d bytes\n", data.cpu_types[cpu_type_index].l2_cacheline);
					fprintf(fout, "  L3 line sz : %d bytes\n", data.cpu_types[cpu_type_index].l3_cacheline);
					fprintf(fout, "  L4 line sz : %d bytes\n", data.cpu_types[cpu_type_index].l4_cacheline);
					fprintf(fout, "  L1D inst.  : %d\n", data.cpu_types[cpu_type_index].l1_data_instances);
					fprintf(fout, "  L1I inst.  : %d\n", data.cpu_types[cpu_type_index].l1_instruction_instances);
					fprintf(fout, "  L2 inst.   : %d\n", data.cpu_types[cpu_type_index].l2_instances);
					fprintf(fout, "  L3 inst.   : %d\n", data.cpu_types[cpu_type_index].l3_instances);
					fprintf(fout, "  L4 inst.   : %d\n", data.cpu_types[cpu_type_index].l4_instances);
					fprintf(fout, "  SSE units  : %d bits (%s)\n", data.cpu_types[cpu_type_index].x86.sse_size, data.cpu_types[cpu_type_index].detection_hints[CPU_HINT_SSE_SIZE_AUTH] ? "authoritative" : "non-authoritative");
				}
				fprintf(fout, "  code name  : `%s'\n", data.cpu_types[cpu_type_index].cpu_codename);
				fprintf(fout, "  features   :");
				/*
				* Here we enumerate all CPU feature bits, and when a feature
				* is present output its name:
				*/
				for (i = 0; i < NUM_CPU_FEATURES; i++)
					if (data.cpu_types[cpu_type_index].flags[i])
						fprintf(fout, " %s", cpu_feature_str(i));
				fprintf(fout, "\n");
			}
		}

		/* Is CPU clock info requested? */
		if (need_clockreport) {
			if (need_timed_clockreport) {
				/* Here we use the RDTSC-based routine */
				fprintf(fout, "  cpu clock  : %d MHz\n",
				        cpu_clock_measure(400, 1));
			} else {
				/* Here we use the OS-provided info */
				fprintf(fout, "  cpu clock  : %d MHz\n",
				        cpu_clock());
			}
		}
	}
	/*
	 * Check if we have any queries to process.
	 * We have to handle the case when `--clock' or `--clock-rdtsc' options
	 * are present.
	 * If in report mode, this will generate spurious output after the
	 * report, if not handled explicitly.
	 */
	only_clock_queries = 1;
	for (i = 0; i < num_requests; i++)
		if (requests[i] != NEED_CLOCK && requests[i] != NEED_CLOCK_RDTSC) {
			only_clock_queries = 0;
			break;
		}
	/* OK, process all queries. */
	if (((!need_report || !only_clock_queries) && num_requests > 0) || need_identify) {
		if (check_need_raw_data()) {
			/* Identify the CPU. Make it do cpuid_get_all_raw_data() itself */
			if (cpu_identify_all(&raw_array, &data) < 0) {
				if (!need_quiet)
					fprintf(stderr,
							"Error identifying the CPU: %s\n",
							cpuid_error());
				return -1;
			}

			for (cpu_type_index = 0; cpu_type_index < data.num_cpu_types; cpu_type_index++) {
				if (raw_array.with_affinity && (cpu_type_index > 0))
					fprintf(fout, "--------------------------------------------------------------------------------\n");
				for (i = 0; i < num_requests; i++)
					print_info(requests[i], &data.cpu_types[cpu_type_index]);
			}
		}
		else
			for (i = 0; i < num_requests; i++)
				print_info(requests[i], NULL);
	}
	if (need_cpulist) {
		print_cpulist();
	}
	if (need_sgx) {
		print_sgx_data(&raw_array.raw[0], &data.cpu_types[0]);
	}
	if (need_hypervisor) {
		print_hypervisor(&raw_array.raw[0], &data.cpu_types[0]);
	}

	cpuid_free_raw_data_array(&raw_array);
	cpuid_free_system_id(&data);
	return 0;
}